

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::resizeEvent(QMdiArea *this,QResizeEvent *resizeEvent)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiAreaPrivate *this_00;
  QPointer<QMdiSubWindow> *pQVar5;
  long lVar6;
  QWidgetData *pQVar7;
  QSize QVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  QSize QVar12;
  ulong uVar13;
  long lVar14;
  QWidget *this_01;
  long lVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  QSize realSize;
  QSize local_60;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((this_00->childWindows).d.size == 0) {
    resizeEvent[0xc] = (QResizeEvent)0x0;
  }
  else {
    QMdiAreaPrivate::updateTabBarGeometry(this_00);
    if (this_00->isSubWindowsTiled == true) {
      this_00->tileCalledFromResizeEvent = true;
      tileSubWindows(this);
      this_00->tileCalledFromResizeEvent = false;
      this_00->isSubWindowsTiled = true;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QBasicTimer::start(&this_00->resizeTimer,200000000,1,
                           *(undefined8 *)
                            &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8);
        return;
      }
      goto LAB_0044b0a8;
    }
    local_58.d = (this_00->childWindows).d.d;
    pQVar5 = (this_00->childWindows).d.ptr;
    local_58.size = (this_00->childWindows).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.ptr = pQVar5;
    if (local_58.size == 0) {
      QMdiAreaPrivate::updateScrollBars(this_00);
LAB_0044b077:
      QMdiAreaPrivate::arrangeMinimizedSubWindows(this_00);
    }
    else {
      lVar14 = local_58.size << 4;
      lVar15 = 0;
      bVar10 = false;
      bVar9 = false;
      do {
        lVar6 = *(long *)((long)&(pQVar5->wp).d + lVar15);
        if ((lVar6 == 0) || (*(int *)(lVar6 + 4) == 0)) {
          this_01 = (QWidget *)0x0;
        }
        else {
          this_01 = *(QWidget **)((long)&(pQVar5->wp).value + lVar15);
        }
        bVar11 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::resizeEvent");
        if (bVar11) {
          bVar11 = QWidget::isMaximized(this_01);
          if (bVar11) {
            pQVar7 = this_01->data;
            uVar1 = (pQVar7->crect).x2;
            uVar3 = (pQVar7->crect).y2;
            uVar2 = (pQVar7->crect).x1;
            uVar4 = (pQVar7->crect).y1;
            iVar17 = -(uint)((int)*(undefined8 *)(resizeEvent + 0x10) == (uVar1 - uVar2) + 1);
            iVar18 = -(uint)((int)((ulong)*(undefined8 *)(resizeEvent + 0x10) >> 0x20) ==
                            (uVar3 - uVar4) + 1);
            auVar16._4_4_ = iVar17;
            auVar16._0_4_ = iVar17;
            auVar16._8_4_ = iVar18;
            auVar16._12_4_ = iVar18;
            iVar17 = movmskpd((int)pQVar7,auVar16);
            if (iVar17 != 3) {
              local_60 = *(QSize *)(resizeEvent + 0x10);
              QVar12 = (QSize)(**(code **)(*(long *)this_01 + 0x78))(this_01);
              if (((ulong)QVar12 & 0x8000000080000000) == 0) {
                uVar13 = (ulong)QVar12 >> 0x20;
                QVar8 = local_60;
                if (local_60.wd.m_i <= QVar12.wd.m_i.m_i) {
                  QVar8 = QVar12;
                }
                if (QVar12.ht.m_i.m_i < local_60.ht.m_i) {
                  uVar13 = (ulong)(uint)local_60.ht.m_i;
                }
                local_60 = (QSize)((ulong)QVar8 & 0xffffffff | uVar13 << 0x20);
              }
              QWidget::resize(this_01,&local_60);
              bVar9 = bVar10;
              if (!bVar10) {
                bVar10 = true;
                bVar9 = true;
              }
            }
          }
        }
        lVar15 = lVar15 + 0x10;
      } while (lVar14 != lVar15);
      QMdiAreaPrivate::updateScrollBars(this_00);
      if (!bVar9) goto LAB_0044b077;
      QBasicTimer::start(&this_00->resizeTimer,200000000,1,
                         *(undefined8 *)
                          &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate.field_0x8);
    }
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0044b0a8:
  __stack_chk_fail();
}

Assistant:

void QMdiArea::resizeEvent(QResizeEvent *resizeEvent)
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty()) {
        resizeEvent->ignore();
        return;
    }

#if QT_CONFIG(tabbar)
    d->updateTabBarGeometry();
#endif

    // Re-tile the views if we're in tiled mode. Re-tile means we will change
    // the geometry of the children, which in turn means 'isSubWindowsTiled'
    // is set to false, so we have to update the state at the end.
    if (d->isSubWindowsTiled) {
        d->tileCalledFromResizeEvent = true;
        tileSubWindows();
        d->tileCalledFromResizeEvent = false;
        d->isSubWindowsTiled = true;
        d->startResizeTimer();
        // We don't have scroll bars or any maximized views.
        return;
    }

    // Resize maximized views.
    bool hasMaximizedSubWindow = false;
    // Take a copy because child->resize() may call QCoreApplication::sendEvent()
    // which may invoke unknown code, that could e.g. recurse into the class
    // modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (sanityCheck(child, "QMdiArea::resizeEvent") && child->isMaximized()
                && child->size() != resizeEvent->size()) {
            auto realSize = resizeEvent->size();
            const auto minSizeHint = child->minimumSizeHint();
            // QMdiSubWindow is no tlw so minimumSize() is not set by the layout manager
            // and therefore we have to take care by ourself that we're not getting smaller
            // than allowed
            if (minSizeHint.isValid())
                realSize = realSize.expandedTo(minSizeHint);
            child->resize(realSize);
            if (!hasMaximizedSubWindow)
                hasMaximizedSubWindow = true;
        }
    }

    d->updateScrollBars();

    // Minimized views are stacked under maximized views so there's
    // no need to re-arrange minimized views on-demand. Start a timer
    // just to make things faster with subsequent resize events.
    if (hasMaximizedSubWindow)
        d->startResizeTimer();
    else
        d->arrangeMinimizedSubWindows();
}